

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cg.c
# Opt level: O0

int evaluate_constant_expr(dill_stream s,sm_ref expr,long *value)

{
  char *pcVar1;
  long lVar2;
  int iVar3;
  ulong uVar4;
  sm_ref in_RDX;
  dill_stream in_RSI;
  long right;
  long left;
  long l;
  char *val;
  bool local_52;
  bool local_51;
  ulong local_40;
  ulong local_38;
  sm_ref in_stack_ffffffffffffffd0;
  dill_stream in_stack_ffffffffffffffd8;
  int local_4;
  
  switch(*(undefined4 *)&in_RSI->j) {
  case 2:
    if (*(int *)((long)&in_RSI[1].j + 4) == 0) {
      local_4 = 0;
    }
    else {
      local_4 = evaluate_constant_expr(in_RSI,in_RDX,(long *)in_stack_ffffffffffffffd8);
    }
    break;
  default:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                  ,0x298,"int evaluate_constant_expr(dill_stream, sm_ref, long *)");
  case 9:
  case 0x15:
  case 0x16:
  case 0x17:
    __assert_fail("FALSE",
                  "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                  ,0x296,"int evaluate_constant_expr(dill_stream, sm_ref, long *)");
  case 0xb:
    lVar2._0_4_ = in_RSI->dill_local_pointer;
    lVar2._4_4_ = in_RSI->dill_param_reg_pointer;
    if ((lVar2 == 0) ||
       (iVar3 = evaluate_constant_expr(in_RSI,in_RDX,(long *)in_stack_ffffffffffffffd8), iVar3 != 0)
       ) {
      if (*(int *)&in_RSI->p == 0x17) {
        iVar3 = cg_get_size(in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
        in_RDX->node_type = (int)(long)iVar3;
        in_RDX->visited = (int)((ulong)(long)iVar3 >> 0x20);
        local_4 = 1;
      }
      else if ((*(long *)&in_RSI->dill_debug == 0) ||
              (iVar3 = evaluate_constant_expr(in_RSI,in_RDX,(long *)in_stack_ffffffffffffffd8),
              iVar3 != 0)) {
        switch(*(undefined4 *)&in_RSI->p) {
        case 0:
          *(long *)in_RDX = (long)local_38 % (long)local_40;
          break;
        case 1:
          *(ulong *)in_RDX = local_38 + local_40;
          break;
        case 2:
          *(ulong *)in_RDX = local_38 - local_40;
          break;
        case 3:
          in_RDX->node_type = (int)(long)(int)(uint)((long)local_38 <= (long)local_40);
          in_RDX->visited =
               (int)((ulong)(long)(int)(uint)((long)local_38 <= (long)local_40) >> 0x20);
          break;
        case 4:
          in_RDX->node_type = (int)(long)(int)(uint)((long)local_38 < (long)local_40);
          in_RDX->visited = (int)((ulong)(long)(int)(uint)((long)local_38 < (long)local_40) >> 0x20)
          ;
          break;
        case 5:
          in_RDX->node_type = (int)(long)(int)(uint)((long)local_40 <= (long)local_38);
          in_RDX->visited =
               (int)((ulong)(long)(int)(uint)((long)local_40 <= (long)local_38) >> 0x20);
          break;
        case 6:
          in_RDX->node_type = (int)(long)(int)(uint)((long)local_40 < (long)local_38);
          in_RDX->visited = (int)((ulong)(long)(int)(uint)((long)local_40 < (long)local_38) >> 0x20)
          ;
          break;
        case 7:
          in_RDX->node_type = (undefined4)local_40;
          in_RDX->visited = local_40._4_4_;
          break;
        case 8:
          in_RDX->node_type = (int)(long)(int)(uint)(local_38 != local_40);
          in_RDX->visited = (int)((ulong)(long)(int)(uint)(local_38 != local_40) >> 0x20);
          break;
        case 9:
          uVar4 = (ulong)(int)(uint)((local_40 != 0 ^ 0xffU) & 1);
          in_RDX->node_type = (int)uVar4;
          in_RDX->visited = (int)(uVar4 >> 0x20);
          break;
        case 10:
          local_51 = local_38 != 0 || local_40 != 0;
          in_RDX->node_type = (int)(long)(int)(uint)local_51;
          in_RDX->visited = (int)((ulong)(long)(int)(uint)local_51 >> 0x20);
          break;
        case 0xb:
          local_52 = local_38 != 0 && local_40 != 0;
          in_RDX->node_type = (int)(long)(int)(uint)local_52;
          in_RDX->visited = (int)((ulong)(long)(int)(uint)local_52 >> 0x20);
          break;
        case 0xc:
          in_RDX->node_type = (int)(local_38 & local_40);
          in_RDX->visited = (int)((local_38 & local_40) >> 0x20);
          break;
        case 0xd:
          in_RDX->node_type = (int)(local_38 | local_40);
          in_RDX->visited = (int)((local_38 | local_40) >> 0x20);
          break;
        case 0xe:
          in_RDX->node_type = (int)(local_38 ^ local_40);
          in_RDX->visited = (int)((local_38 ^ local_40) >> 0x20);
          break;
        case 0xf:
          uVar4 = local_38 << ((byte)local_40 & 0x3f);
          in_RDX->node_type = (int)uVar4;
          in_RDX->visited = (int)(uVar4 >> 0x20);
          break;
        case 0x10:
          uVar4 = (long)local_38 >> ((byte)local_40 & 0x3f);
          in_RDX->node_type = (int)uVar4;
          in_RDX->visited = (int)(uVar4 >> 0x20);
          break;
        case 0x11:
          *(ulong *)in_RDX = local_38 * local_40;
          break;
        case 0x12:
          *(long *)in_RDX = (long)local_38 / (long)local_40;
          break;
        case 0x13:
        case 0x14:
        case 0x15:
        case 0x16:
        case 0x17:
          __assert_fail("FALSE",
                        "/workspace/llm4binary/github/license_c_cmakelists/ornladios[P]ADIOS2/thirdparty/ffs/ffs/cod/cg.c"
                        ,0x28c,"int evaluate_constant_expr(dill_stream, sm_ref, long *)");
        case 0x18:
          in_RDX->node_type = (int)(local_40 ^ 0xffffffffffffffff);
          in_RDX->visited = (int)((local_40 ^ 0xffffffffffffffff) >> 0x20);
        }
        local_4 = 1;
      }
      else {
        local_4 = 0;
      }
    }
    else {
      local_4 = 0;
    }
    break;
  case 0xd:
    local_4 = evaluate_constant_expr(in_RSI,in_RDX,(long *)in_stack_ffffffffffffffd8);
    break;
  case 0xe:
    pcVar1 = *(char **)&in_RSI->dill_local_pointer;
    if (*pcVar1 == '0') {
      if (pcVar1[1] == 'x') {
        iVar3 = __isoc99_sscanf(pcVar1 + 2,"%lx",&stack0xffffffffffffffd0);
        if (iVar3 != 1) {
          printf("sscanf failed\n");
        }
      }
      else {
        iVar3 = __isoc99_sscanf(pcVar1,"%lo",&stack0xffffffffffffffd0);
        if (iVar3 != 1) {
          printf("sscanf failed\n");
        }
      }
    }
    else {
      iVar3 = __isoc99_sscanf(pcVar1,"%ld",&stack0xffffffffffffffd0);
      if (iVar3 != 1) {
        printf("sscanf failed\n");
      }
    }
    *(sm_ref *)in_RDX = in_stack_ffffffffffffffd0;
    local_4 = 1;
    break;
  case 0x18:
    local_4 = evaluate_constant_expr(in_RSI,in_RDX,(long *)in_stack_ffffffffffffffd8);
  }
  return local_4;
}

Assistant:

static int
evaluate_constant_expr(dill_stream s, sm_ref expr, long*value)
{
    switch(expr->node_type) {
    case cod_constant: {
	char *val = expr->node.constant.const_val;
	long l;
	if (val[0] == '0') {
	    /* hex or octal */
	    if (val[1] == 'x') {
		/* hex */
		if (sscanf(val+2, "%lx", &l) != 1) 
		    printf("sscanf failed\n");
	    } else {
		if (sscanf(val, "%lo", &l) != 1) 
		    printf("sscanf failed\n");
	    }
	} else {
	    if (sscanf(val, "%ld", &l) != 1)
		printf("sscanf failed\n");
	}
	*value = l;
	return 1;
    }
    case cod_identifier:
	return evaluate_constant_expr(s, expr->node.identifier.sm_declaration, value);
    case cod_declaration:
	if (!expr->node.declaration.const_var) return 0;
	return evaluate_constant_expr(s, expr->node.declaration.init_value, value);
    case cod_operator: {
	long left, right;
	if (expr->node.operator.left != NULL) {
	    if (!evaluate_constant_expr(s, expr->node.operator.left, &left)) return 0;
	}
	if (expr->node.operator.op == op_sizeof) {
	    *value = cg_get_size(s, expr->node.operator.right);
	    return 1;
	}
	if (expr->node.operator.right != NULL) {
	    if (!evaluate_constant_expr(s, expr->node.operator.right, &right)) return 0;
	}
	switch(expr->node.operator.op) {
	case  op_modulus:
	    *value = left % right;
	    break;
	case  op_plus:
	    *value = left + right;
	    break;
	case  op_minus:
	    *value = left - right;
	    break;
	case  op_leq:
	    *value = left <= right;
	    break;
	case  op_lt:
	    *value = left < right;
	    break;
	case  op_geq:
	    *value = left >= right;
	    break;
	case  op_gt:
	    *value = left > right;
	    break;
	case  op_eq:
	    *value = left = right;
	    break;
	case  op_neq:
	    *value = left != right;
	    break;
	case  op_log_or:
	    *value = left || right;
	    break;
	case  op_arith_or:
	    *value = left | right;
	    break;
	case  op_arith_xor:
	    *value = left ^ right;
	    break;
	case  op_log_and:
	    *value = left && right;
	    break;
	case  op_arith_and:
	    *value = left & right;
	    break;
	case  op_mult:
	    *value = left * right;
	    break;
	case  op_div:
	    *value = left / right;
	    break;
	case op_log_neg:
	    *value = !right;
	    break;
	case op_not:
	    *value = ~right;
	    break;
	case op_left_shift:
	    *value = left << right;
	    break;
	case op_right_shift:
	    *value = left >> right;
	    break;
	case  op_deref:
	case  op_address:
	case op_inc:
	case op_dec:
	case op_sizeof:
	    assert(FALSE);
	}
	return 1;
    }
    case cod_cast:
	return evaluate_constant_expr(s, expr->node.cast.expression, value);
    case cod_assignment_expression:
    case cod_field_ref:
    case cod_element_ref:
    case cod_subroutine_call:
	assert(FALSE);
    default:
	assert(FALSE);
    }
    return 0;
}